

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O3

void __thiscall
mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
          (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *this,QuadAndLinTerms *le,
          AlgConRhs<_1> rr,bool fSort)

{
  QuadTerms *this_00;
  undefined3 in_register_00000011;
  
  (this->super_BasicConstraint).name_._M_dataplus._M_p =
       (pointer)&(this->super_BasicConstraint).name_.field_2;
  (this->super_BasicConstraint).name_._M_string_length = 0;
  (this->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  gch::detail::small_vector_base<std::allocator<double>,_6U>::move_initialize<6U,_nullptr>
            ((small_vector_base<std::allocator<double>,_6U> *)&this->super_QuadAndLinTerms,
             (small_vector_base<std::allocator<double>,_6U> *)le);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
            (&(this->super_QuadAndLinTerms).super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>,
             &(le->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>);
  this_00 = &(this->super_QuadAndLinTerms).super_QuadTerms;
  gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
  move_initialize<8U,_nullptr>
            ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             this_00,(small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      *)&le->super_QuadTerms);
  gch::detail::small_vector_base<std::allocator<double>,_6U>::move_initialize<6U,_nullptr>
            (&(this->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
              super_small_vector_base<std::allocator<double>,_6U>,
             &(le->super_QuadTerms).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
            (&(this->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
              super_small_vector_base<std::allocator<int>,_6U>,
             &(le->super_QuadTerms).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
            (&(this->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
              super_small_vector_base<std::allocator<int>,_6U>,
             &(le->super_QuadTerms).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>);
  (this->super_AlgConRhs<_1>).rhs_ = rr.rhs_;
  if (CONCAT31(in_register_00000011,fSort) != 0) {
    LinTerms::sort_terms(&(this->super_QuadAndLinTerms).super_LinTerms,true);
    QuadTerms::sort_terms(this_00);
  }
  return;
}

Assistant:

AlgebraicConstraint(Body le, RhsOrRange rr, bool fSort=true)
    : Body(std::move(le)), RhsOrRange(std::move(rr))
  { if (fSort) sort_terms(); }